

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemRealify(Mem *pMem)

{
  double dVar1;
  Mem *pMem_local;
  
  dVar1 = sqlite3VdbeRealValue(pMem);
  (pMem->u).r = dVar1;
  pMem->flags = pMem->flags & 0xf240 | 8;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemRealify(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );

  pMem->u.r = sqlite3VdbeRealValue(pMem);
  MemSetTypeFlag(pMem, MEM_Real);
  return SQLITE_OK;
}